

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# video_test.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *pvVar1;
  char cVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  Scalar_ *pSVar9;
  int iVar10;
  ulong uVar11;
  double dVar12;
  __m128d t;
  double dVar13;
  _InputArray local_1008;
  double local_fe8;
  CommandLineParser parser;
  _InputArray local_fd8;
  int local_fbc;
  double local_fb8;
  Ptr<cv::ximgproc::EdgeDrawing> ed;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_fa8;
  long local_fa0;
  int local_f98;
  int local_f94;
  int local_f90;
  int local_f8c;
  vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_> lines;
  undefined8 local_f20;
  VideoCapture capture;
  String filename;
  vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> ellipses;
  _OutputArray local_ea8;
  vector<LS,_std::allocator<LS>_> linesegments;
  Mat diff;
  Mat lineImg0;
  int local_e08;
  int local_e04;
  Mat gray;
  EDCircles testEDCircles;
  Mat lineImg1;
  Mat src;
  double val;
  Mat *local_9a0;
  Size local_998;
  pointer pvStack_990;
  Mat local_708 [96];
  ED local_6a8;
  ED local_480;
  ED testED;
  
  pvVar1 = &testEDCircles.super_EDPF.super_ED.segmentPoints;
  testEDCircles.super_EDPF.super_ED._0_8_ = pvVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&testEDCircles,
             "{scale|1|}{counter|99999|}{show|false|}{@filename|vtest.avi|}","");
  cv::CommandLineParser::CommandLineParser(&parser,argc,argv,(string *)&testEDCircles);
  if ((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
       *)testEDCircles.super_EDPF.super_ED._0_8_ != pvVar1) {
    operator_delete((void *)testEDCircles.super_EDPF.super_ED._0_8_);
  }
  testEDCircles.super_EDPF.super_ED._0_8_ = pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&testEDCircles,"@filename","");
  cv::CommandLineParser::get<std::__cxx11::string>(&filename,&parser,(String *)&testEDCircles,true);
  if ((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
       *)testEDCircles.super_EDPF.super_ED._0_8_ != pvVar1) {
    operator_delete((void *)testEDCircles.super_EDPF.super_ED._0_8_);
  }
  testEDCircles.super_EDPF.super_ED._0_8_ = pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&testEDCircles,"scale","");
  val = 0.0;
  cv::CommandLineParser::getByName((string *)&parser,SUB81(&testEDCircles,0),BOOLEAN,(void *)0x2);
  local_fe8 = val;
  if ((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
       *)testEDCircles.super_EDPF.super_ED._0_8_ != pvVar1) {
    operator_delete((void *)testEDCircles.super_EDPF.super_ED._0_8_);
  }
  testEDCircles.super_EDPF.super_ED._0_8_ = pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&testEDCircles,"counter","");
  val = (double)((ulong)val & 0xffffffff00000000);
  cv::CommandLineParser::getByName((string *)&parser,SUB81(&testEDCircles,0),BOOLEAN,(void *)0x0);
  iVar10 = val._0_4_;
  if ((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
       *)testEDCircles.super_EDPF.super_ED._0_8_ != pvVar1) {
    operator_delete((void *)testEDCircles.super_EDPF.super_ED._0_8_);
  }
  testEDCircles.super_EDPF.super_ED._0_8_ = pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&testEDCircles,"show","");
  pSVar9 = (Scalar_ *)&val;
  val = (double)((ulong)val & 0xffffffffffffff00);
  cv::CommandLineParser::getByName((string *)&parser,SUB81(&testEDCircles,0),BOOLEAN,(void *)0x1);
  local_fb8 = (double)CONCAT71(local_fb8._1_7_,val._0_1_);
  if ((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
       *)testEDCircles.super_EDPF.super_ED._0_8_ != pvVar1) {
    operator_delete((void *)testEDCircles.super_EDPF.super_ED._0_8_);
  }
  cv::Mat::Mat(&src);
  cv::Mat::Mat(&gray);
  cv::samples::findFile((string *)&testEDCircles,SUB81(&filename,0),false);
  val = (double)&local_998;
  if (testEDCircles.super_EDPF.super_ED.srcImg == (uchar *)0x0) {
    std::__cxx11::string::_M_construct<char*>
              ((string *)&val,filename._M_dataplus._M_p,
               filename._M_dataplus._M_p + filename._M_string_length);
    if ((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
         *)testEDCircles.super_EDPF.super_ED._0_8_ != pvVar1) {
      operator_delete((void *)testEDCircles.super_EDPF.super_ED._0_8_);
    }
  }
  else {
    if ((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
         *)testEDCircles.super_EDPF.super_ED._0_8_ == pvVar1) {
      pvStack_990 = testEDCircles.super_EDPF.super_ED.segmentPoints.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      val = (double)testEDCircles.super_EDPF.super_ED._0_8_;
    }
    local_998 = (Size)testEDCircles.super_EDPF.super_ED.segmentPoints.
                      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    local_9a0 = (Mat *)testEDCircles.super_EDPF.super_ED.srcImg;
  }
  cv::VideoCapture::VideoCapture(&capture,(string *)&val,0);
  if ((Size *)val != &local_998) {
    operator_delete((void *)val);
  }
  cVar2 = cv::VideoCapture::isOpened();
  if (cVar2 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Capture is opened, ",0x13);
    dVar13 = (double)cv::VideoCapture::get((int)&capture);
    poVar3 = std::ostream::_M_insert<double>(dVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," frames",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Frame [width,height] : [",0x18);
    dVar13 = (double)cv::VideoCapture::get((int)&capture);
    poVar3 = std::ostream::_M_insert<double>(dVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
    dVar13 = (double)cv::VideoCapture::get((int)&capture);
    poVar3 = std::ostream::_M_insert<double>(dVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Scaled[width,height] : [",0x18);
    dVar13 = (double)cv::VideoCapture::get((int)&capture);
    poVar3 = std::ostream::_M_insert<double>(dVar13 * local_fe8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
    dVar13 = (double)cv::VideoCapture::get((int)&capture);
    poVar3 = std::ostream::_M_insert<double>(dVar13 * local_fe8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    cv::ximgproc::createEdgeDrawing();
    *(undefined8 *)((long)_ed + 0xc) = 0x2400000001;
    *(undefined8 *)((long)_ed + 0x14) = 0x100000008;
    ellipses.super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ellipses.super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ellipses.super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    lines.super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lines.super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    lines.super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar7 = 0;
    local_fa0 = 0;
    local_fbc = 0;
    while( true ) {
      iVar8 = (int)pSVar9;
      cv::VideoCapture::operator>>(&capture,&src);
      cVar2 = cv::Mat::empty();
      if (cVar2 != '\0' || iVar10 < 1) break;
      testEDCircles.super_EDPF.super_ED.segmentPoints.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      testEDCircles.super_EDPF.super_ED.width = 0x1010000;
      local_998.width = 0;
      local_998.height = 0;
      val = (double)CONCAT44(val._4_4_,0x2010000);
      local_f20 = 0;
      testEDCircles.super_EDPF.super_ED.srcImg = (uchar *)&src;
      local_9a0 = &src;
      cv::resize(SUB84(local_fe8,0),local_fe8,&testEDCircles,(_InputArray *)&val,&local_f20);
      testEDCircles.super_EDPF.super_ED.segmentPoints.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      testEDCircles.super_EDPF.super_ED.width = 0x1010000;
      local_998.width = 0;
      local_998.height = 0;
      val = (double)CONCAT44(val._4_4_,0x2010000);
      local_9a0 = &gray;
      testEDCircles.super_EDPF.super_ED.srcImg = (uchar *)&src;
      cv::cvtColor((cv *)&testEDCircles,(_InputArray *)&val,(_OutputArray *)0x6,0,iVar8);
      lVar4 = cv::getTickCount();
      testEDCircles.super_EDPF.super_ED.segmentPoints.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      testEDCircles.super_EDPF.super_ED.width = 0x1010000;
      testEDCircles.super_EDPF.super_ED.srcImg = (uchar *)&gray;
      (**(code **)(*_ed + 0x40))(_ed,&testEDCircles);
      testEDCircles.super_EDPF.super_ED.segmentPoints.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      testEDCircles.super_EDPF.super_ED.width = -0x7dfcffe3;
      testEDCircles.super_EDPF.super_ED.srcImg = (uchar *)&lines;
      (**(code **)(*_ed + 0x60))(_ed,&testEDCircles);
      testEDCircles.super_EDPF.super_ED.segmentPoints.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      testEDCircles.super_EDPF.super_ED.width = -0x7dfcffd2;
      testEDCircles.super_EDPF.super_ED.srcImg = (uchar *)&ellipses;
      (**(code **)(*_ed + 0x68))(_ed,&testEDCircles);
      lVar5 = cv::getTickCount();
      lVar5 = lVar5 - lVar4;
      if (lVar4 == 0) {
        lVar5 = 0;
      }
      lVar4 = cv::getTickCount();
      cv::Mat::Mat(local_708,&gray);
      pSVar9 = (Scalar_ *)0x8;
      ED::ED(&testED,local_708,SOBEL_OPERATOR,0x24,8,1,10,1.0,true);
      cv::Mat::~Mat(local_708);
      ED::ED(&local_480,&testED);
      EDLines::EDLines((EDLines *)&val,&local_480,1.0,-1,6.0,1.3);
      cv::Mat::~Mat(&local_480.gradImage);
      cv::Mat::~Mat(&local_480.edgeImage);
      if (local_480.edgePoints.
          super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_480.edgePoints.
                        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_480.anchorPoints.
          super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_480.anchorPoints.
                        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      cv::Mat::~Mat(&local_480.srcImage);
      cv::Mat::~Mat(&local_480.smoothImage);
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::~vector(&local_480.segmentPoints);
      ED::ED(&local_6a8,(ED *)&val);
      EDCircles::EDCircles(&testEDCircles,&local_6a8);
      cv::Mat::~Mat(&local_6a8.gradImage);
      cv::Mat::~Mat(&local_6a8.edgeImage);
      if (local_6a8.edgePoints.
          super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_6a8.edgePoints.
                        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_6a8.anchorPoints.
          super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_6a8.anchorPoints.
                        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      cv::Mat::~Mat(&local_6a8.srcImage);
      cv::Mat::~Mat(&local_6a8.smoothImage);
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::~vector(&local_6a8.segmentPoints);
      lVar6 = cv::getTickCount();
      lVar6 = lVar6 - lVar4;
      if (lVar4 == 0) {
        lVar6 = 0;
      }
      if (local_fb8._0_1_ != '\0') {
        EDLines::getLines(&linesegments,(EDLines *)&val);
        EDLines::getLineImage((EDLines *)&lineImg0);
        _diff = 0x406fe00000000000;
        pSVar9 = (Scalar_ *)&diff;
        cv::Mat::Mat(&lineImg1,local_e08,local_e04,0,pSVar9);
        if (lines.super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>._M_impl
            .super__Vector_impl_data._M_finish !=
            lines.super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>._M_impl
            .super__Vector_impl_data._M_start) {
          lVar4 = 0xc;
          uVar11 = 0;
          do {
            local_1008.sz.width = 0;
            local_1008.sz.height = 0;
            local_1008.flags = 0x3010000;
            local_1008.obj = &lineImg1;
            local_f90 = (int)ROUND(*(float *)(lines.
                                              super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start +
                                             lVar4 + -0xc));
            local_f8c = (int)ROUND(*(float *)(lines.
                                              super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start + lVar4 + -8
                                             ));
            local_f98 = (int)ROUND(*(float *)(lines.
                                              super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start + lVar4 + -4
                                             ));
            local_f94 = (int)ROUND(*(float *)(lines.
                                              super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start + lVar4));
            _diff = 0;
            pSVar9 = (Scalar_ *)0x1;
            cv::line(&local_1008,&local_f90,&local_f98,&diff,1,0x10,0);
            uVar11 = uVar11 + 1;
            lVar4 = lVar4 + 0x10;
          } while (uVar11 < (ulong)((long)lines.
                                          super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)lines.
                                          super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4));
        }
        cv::Mat::Mat(&diff);
        local_1008.sz.width = 0;
        local_1008.sz.height = 0;
        local_1008.flags = 0x1010000;
        local_1008.obj = &lineImg0;
        local_fd8.sz.width = 0;
        local_fd8.sz.height = 0;
        local_fd8.flags = 0x1010000;
        local_fd8.obj = &lineImg1;
        local_ea8.super__InputArray.sz.width = 0;
        local_ea8.super__InputArray.sz.height = 0;
        local_ea8.super__InputArray.flags = 0x2010000;
        local_ea8.super__InputArray.obj = &diff;
        cv::absdiff(&local_1008,&local_fd8,&local_ea8);
        local_1008._0_8_ = &local_1008.sz;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1008,"lineImg0","");
        local_fd8.sz.width = 0;
        local_fd8.sz.height = 0;
        local_fd8.flags = 0x1010000;
        local_fd8.obj = &lineImg0;
        cv::imshow((string *)&local_1008,&local_fd8);
        if ((Size *)local_1008._0_8_ != &local_1008.sz) {
          operator_delete((void *)local_1008._0_8_);
        }
        local_1008._0_8_ = &local_1008.sz;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1008,"lineImg1","");
        local_fd8.sz.width = 0;
        local_fd8.sz.height = 0;
        local_fd8.flags = 0x1010000;
        local_fd8.obj = &lineImg1;
        cv::imshow((string *)&local_1008,&local_fd8);
        if ((Size *)local_1008._0_8_ != &local_1008.sz) {
          operator_delete((void *)local_1008._0_8_);
        }
        local_1008._0_8_ = &local_1008.sz;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1008,"diff","");
        local_fd8.sz.width = 0;
        local_fd8.sz.height = 0;
        local_fd8.flags = 0x1010000;
        local_fd8.obj = &diff;
        cv::imshow((string *)&local_1008,&local_fd8);
        if ((Size *)local_1008._0_8_ != &local_1008.sz) {
          operator_delete((void *)local_1008._0_8_);
        }
        local_1008._0_8_ = &local_1008.sz;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1008,"gray","");
        local_fd8.sz.width = 0;
        local_fd8.sz.height = 0;
        local_fd8.flags = 0x1010000;
        local_fd8.obj = &gray;
        cv::imshow((string *)&local_1008,&local_fd8);
        if ((Size *)local_1008._0_8_ != &local_1008.sz) {
          operator_delete((void *)local_1008._0_8_);
        }
        cv::waitKey(0);
        cv::Mat::~Mat(&diff);
        cv::Mat::~Mat(&lineImg1);
        cv::Mat::~Mat(&lineImg0);
        if (linesegments.super__Vector_base<LS,_std::allocator<LS>_>._M_impl.super__Vector_impl_data
            ._M_start != (pointer)0x0) {
          operator_delete(linesegments.super__Vector_base<LS,_std::allocator<LS>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      EDCircles::~EDCircles(&testEDCircles);
      EDLines::~EDLines((EDLines *)&val);
      cv::Mat::~Mat(&testED.gradImage);
      cv::Mat::~Mat(&testED.edgeImage);
      if (testED.edgePoints.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(testED.edgePoints.
                        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (testED.anchorPoints.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(testED.anchorPoints.
                        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      iVar10 = iVar10 + -1;
      local_fa0 = local_fa0 + lVar5;
      local_fbc = local_fbc + 1;
      lVar7 = lVar7 + lVar6;
      cv::Mat::~Mat(&testED.srcImage);
      cv::Mat::~Mat(&testED.smoothImage);
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::~vector(&testED.segmentPoints);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"OpenCV    processed ",0x14);
    iVar10 = local_fbc;
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_fbc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," frames in    ",0xe);
    dVar13 = (double)cv::getTickFrequency();
    local_fe8 = (double)local_fa0;
    poVar3 = std::ostream::_M_insert<double>((local_fe8 / dVar13) * 1000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ms.",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tfps : ",8);
    dVar13 = (double)cv::getTickFrequency();
    dVar12 = (double)(iVar10 * 1000);
    dVar13 = local_fe8 / dVar13;
    local_fe8 = dVar12;
    poVar3 = std::ostream::_M_insert<double>(dVar12 / (dVar13 * 1000.0));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"EDCircles processed ",0x14);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," frames in    ",0xe);
    dVar13 = (double)cv::getTickFrequency();
    local_fb8 = (double)lVar7;
    poVar3 = std::ostream::_M_insert<double>((local_fb8 / dVar13) * 1000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ms.",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tfps : ",8);
    dVar13 = (double)cv::getTickFrequency();
    poVar3 = std::ostream::_M_insert<double>(local_fe8 / ((local_fb8 / dVar13) * 1000.0));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if (lines.super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(lines.
                      super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (ellipses.super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(ellipses.
                      super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_fa8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_fa8);
    }
  }
  cv::VideoCapture::~VideoCapture(&capture);
  cv::Mat::~Mat(&gray);
  cv::Mat::~Mat(&src);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != &filename.field_2) {
    operator_delete(filename._M_dataplus._M_p);
  }
  cv::CommandLineParser::~CommandLineParser(&parser);
  return 0;
}

Assistant:

int main(int argc, const char** argv)
{
    cv::CommandLineParser parser(argc, argv,
        "{scale|1|}"
        "{counter|99999|}"
        "{show|false|}"
        "{@filename|vtest.avi|}"
    );

    String filename = parser.get<string>("@filename");
    double scale = parser.get<double>("scale");
    int test_counter = parser.get<int>("counter");
    bool show = parser.get<bool>("show");
    Mat src, gray;
    TickMeter tm0, tm1;
    int counter = 0;

    VideoCapture capture(samples::findFileOrKeep(filename));
    if (capture.isOpened())
    {
        cout << "Capture is opened, " << capture.get(CAP_PROP_FRAME_COUNT) << " frames" << endl;
        cout << "Frame [width,height] : ["  << capture.get(CAP_PROP_FRAME_WIDTH) << "," << capture.get(CAP_PROP_FRAME_HEIGHT) << "]" << endl;
        cout << "Scaled[width,height] : [" << capture.get(CAP_PROP_FRAME_WIDTH) * scale << "," << capture.get(CAP_PROP_FRAME_HEIGHT) * scale << "]" << endl;;

        Ptr<EdgeDrawing> ed = createEdgeDrawing();
        ed->params.EdgeDetectionOperator = EdgeDrawing::SOBEL;
        ed->params.GradientThresholdValue = 36;
        ed->params.AnchorThresholdValue = 8;
        ed->params.ScanInterval = 1;
        vector<Vec6d> ellipses;
        vector<Vec4f> lines;

        for (;;)
        {
            capture >> src;
            test_counter--;

            if (src.empty() || test_counter < 0)
                break;

            resize(src, src, Size(), scale, scale);
            cvtColor(src, gray, COLOR_BGR2GRAY);

            tm0.start();
            ed->detectEdges(gray);
            ed->detectLines(lines);
            ed->detectEllipses(ellipses);
            tm0.stop();
            counter++;

            tm1.start();
            ED testED = ED(gray, SOBEL_OPERATOR, 36, 8, 1, 10, 1.0, true);
            EDLines testEDLines = EDLines(testED);
            EDCircles testEDCircles = EDCircles(testEDLines);
            tm1.stop();

            if (show)
            {
                std::vector<LS> linesegments = testEDLines.getLines();

                Mat lineImg0 = testEDLines.getLineImage();    //draws on an empty image
                Mat lineImg1 = Mat(lineImg0.rows, lineImg0.cols, CV_8UC1, Scalar(255));

                for (int i = 0; i < lines.size(); i++)
                    line(lineImg1, Point2d(lines[i][0], lines[i][1]), Point2d(lines[i][2], lines[i][3]), Scalar(0), 1, LINE_AA);

                Mat diff;
                absdiff(lineImg0, lineImg1, diff);
                imshow("lineImg0", lineImg0);
                imshow("lineImg1", lineImg1);
                imshow("diff", diff);
                imshow("gray", gray);
                waitKey();
            }
        }

        cout << "OpenCV    processed " << counter << " frames in    " << tm0.getTimeMilli() << " ms.";
        cout << "\t\tfps : " << counter * 1000 / tm0.getTimeMilli() << endl;

        cout << "EDCircles processed " << counter << " frames in    " << tm1.getTimeMilli() << " ms.";
        cout << "\t\tfps : " << counter * 1000 / tm1.getTimeMilli() << endl;
    }
    return 0;
}